

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O1

void __thiscall
sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::
insertnonleaf(BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this
             ,unsigned_long_long *key,int *cur,node **p,int *pp,locType *pos,locType wz)

{
  int iVar1;
  long lVar2;
  locType *plVar3;
  node *pnVar4;
  undefined4 extraout_var_00;
  ulong uVar5;
  long lVar6;
  locType extraout_RDX;
  locType extraout_RDX_00;
  long lVar7;
  locType *plVar8;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar9;
  pair<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node_*,_long>
  lnk;
  locType tmpp [101];
  unsigned_long_long tmpk [100];
  int local_69c;
  long local_698;
  locType local_690;
  locType local_688 [100];
  undefined8 local_368;
  unsigned_long_long auStack_358 [101];
  undefined4 extraout_var;
  
  lVar7 = (long)*cur;
  if (lVar7 == -1) {
    iVar1 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base[1])();
    plVar3 = (locType *)CONCAT44(extraout_var,iVar1);
    this->root = extraout_RDX;
    this->depth = this->depth + 1;
    plVar8 = &this->root;
    *(undefined4 *)(plVar3 + 200) = 1;
    plVar3[0x65] = *key;
    *plVar3 = *pos;
    plVar3[1] = wz;
    pDVar9 = this->file;
  }
  else {
    iVar1 = pp[lVar7];
    lVar2 = (long)iVar1;
    pnVar4 = p[lVar7];
    lVar6 = (long)pnVar4->sz;
    if (0x62 < lVar6) {
      local_688[0] = (pnVar4->field_0).pointer[0];
      if (0 < iVar1) {
        lVar6 = 0;
        do {
          local_688[lVar6 + 1] = *(locType *)((long)&pnVar4->field_0 + lVar6 * 8 + 8);
          auStack_358[lVar6] = pnVar4->keyvalue[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar2 != lVar6);
      }
      local_688[lVar2 + 1] = wz;
      auStack_358[lVar2] = *key;
      if (iVar1 < 99) {
        do {
          local_688[lVar2 + 2] = *(locType *)((long)&pnVar4->field_0 + lVar2 * 8 + 8);
          auStack_358[lVar2 + 1] = pnVar4->keyvalue[lVar2];
          iVar1 = (int)lVar2;
          lVar2 = lVar2 + 1;
        } while (iVar1 != 0x62);
      }
      pnVar4->sz = 0x32;
      pnVar4 = p[lVar7];
      iVar1 = pnVar4->sz;
      if (iVar1 < 1) {
        lVar6 = 0;
      }
      else {
        lVar6 = 0;
        do {
          (pnVar4->field_0).pointer[lVar6] = local_688[lVar6];
          pnVar4 = p[lVar7];
          pnVar4->keyvalue[lVar6] = auStack_358[lVar6];
          lVar6 = lVar6 + 1;
          iVar1 = pnVar4->sz;
        } while (lVar6 < iVar1);
      }
      (pnVar4->field_0).pointer[iVar1] = local_688[lVar6];
      iVar1 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[1])();
      local_698 = CONCAT44(extraout_var_00,iVar1);
      uVar5 = (ulong)p[lVar7]->sz;
      if ((long)uVar5 < 99) {
        lVar6 = uVar5 + 1;
        do {
          iVar1 = (int)uVar5;
          *(locType *)(local_698 + (long)(iVar1 - p[lVar7]->sz) * 8) = local_688[lVar6];
          *(unsigned_long_long *)(local_698 + 0x328 + (long)(iVar1 - p[lVar7]->sz) * 8) =
               auStack_358[lVar6];
          uVar5 = (ulong)(iVar1 + 1);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 100);
      }
      lVar6 = 99 - (long)p[lVar7]->sz;
      *(int *)(local_698 + 0x640) = (int)lVar6;
      *(undefined8 *)(local_698 + lVar6 * 8) = local_368;
      local_690 = extraout_RDX_00;
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])();
      (*(this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
        )._vptr_FileManager_Base[3])(this->file,pos + *cur);
      local_69c = *cur + -1;
      insertnonleaf(this,auStack_358 + p[lVar7]->sz,&local_69c,p,pp,pos,local_690);
      return;
    }
    if (iVar1 < pnVar4->sz) {
      do {
        pnVar4 = p[lVar7];
        pnVar4->keyvalue[lVar6] = pnVar4->keyvalue[lVar6 + -1];
        *(locType *)((long)&pnVar4->field_0 + lVar6 * 8 + 8) = (pnVar4->field_0).pointer[lVar6];
        lVar6 = lVar6 + -1;
      } while (lVar2 < lVar6);
    }
    pnVar4 = p[lVar7];
    pnVar4->keyvalue[lVar2] = *key;
    *(locType *)((long)&pnVar4->field_0 + lVar2 * 8 + 8) = wz;
    p[lVar7]->sz = p[lVar7]->sz + 1;
    pDVar9 = this->file;
    plVar8 = pos + *cur;
  }
  (*(pDVar9->
    super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
    )._vptr_FileManager_Base[3])(pDVar9,plVar8);
  return;
}

Assistant:

void insertnonleaf(const Key &key, const int &cur, node **p, int *pp, locType *pos, locType wz) {
            if (cur == -1) {
                auto lnk = file->newspace();
                root = lnk.second;
                node *x = lnk.first;
                ++depth;
                x->sz = 1;
                x->keyvalue[0] = key;
                x->pointer[0] = pos[0];
                x->pointer[1] = wz;
                file->save(root);
                return;
            }
            node *&x = p[cur];
            int i, j = pp[cur];
            if (x->sz < degree - 1) {
                for (i = x->sz; i > j; --i)x->keyvalue[i] = x->keyvalue[i - 1], x->pointer[i + 1] = x->pointer[i];
                x->keyvalue[j] = key;
                x->pointer[j + 1] = wz;
                ++x->sz;
                file->save(pos[cur]);
            } else {
                locType tmpp[degree + 1];
                Key tmpk[degree];
                tmpp[0] = x->pointer[0];
                for (i = 0; i < j; ++i)tmpp[i + 1] = x->pointer[i + 1], tmpk[i] = x->keyvalue[i];
                tmpp[j + 1] = wz;
                tmpk[j] = key;
                for (i = j + 1; i < degree; ++i)tmpp[i + 1] = x->pointer[i], tmpk[i] = x->keyvalue[i - 1];
                x->sz = degree >> 1;
                for (i = 0; i < x->sz; ++i)x->pointer[i] = tmpp[i], x->keyvalue[i] = tmpk[i];
                x->pointer[x->sz] = tmpp[i];
                auto lnk = file->newspace();
                node *y = lnk.first;
                for (i = x->sz + 1; i < degree; ++i)
                    y->pointer[i - x->sz - 1] = tmpp[i], y->keyvalue[i - x->sz - 1] = tmpk[i];
                y->sz = degree - 1 - x->sz;
                y->pointer[y->sz] = tmpp[degree];
                file->save(lnk.second);
                file->save(pos[cur]);
                insertnonleaf(tmpk[x->sz], cur - 1, p, pp, pos, lnk.second);
            }
        }